

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<int>::GetSub
          (TPZMatrix<int> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          TPZFMatrix<int> *A)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int local_4c;
  int64_t local_48;
  long local_40;
  long local_38;
  
  local_48 = rowSize;
  if ((rowSize + sRow <= (this->super_TPZBaseMatrix).fRow) &&
     (colSize + sCol <= (this->super_TPZBaseMatrix).fCol)) {
    local_40 = colSize;
    local_38 = sCol;
    (*(A->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (A,rowSize,colSize);
    lVar1 = local_38;
    if (0 < rowSize) {
      lVar5 = 0;
      lVar3 = local_40;
      do {
        if (0 < lVar3) {
          lVar4 = 0;
          do {
            local_4c = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                 (this,sRow,lVar1 + lVar4);
            (*(A->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                      (A,lVar5,lVar4,&local_4c);
            lVar4 = lVar4 + 1;
            lVar3 = local_40;
          } while (local_40 != lVar4);
        }
        lVar5 = lVar5 + 1;
        sRow = sRow + 1;
      } while (lVar5 != local_48);
    }
    return 1;
  }
  iVar2 = Error("GetSub <t.he sub-matrix is too big>",(char *)0x0);
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::GetSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							const int64_t colSize, TPZFMatrix<TVar> & A ) const {
    if ( ((sRow + rowSize) > Rows()) || ((sCol + colSize) > Cols()) ) {
        return( Error( "GetSub <t.he sub-matrix is too big>" ) );
    }
    A.Resize( rowSize, colSize );
    int64_t row = sRow;
    for ( int64_t r = 0; r < rowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < colSize; c++, col++ ) {
            A.PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}